

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_640;
  reference_wrapper<bool> local_638;
  reference_wrapper<Direction> local_630;
  reference_wrapper<Direction> local_628;
  thread local_620;
  thread thread_for_read_input;
  Page page;
  value_type local_5a0;
  value_type local_598;
  value_type local_590;
  value_type local_588;
  value_type local_580;
  value_type local_578;
  value_type local_570;
  allocator<char> local_561;
  string local_560;
  Point local_540;
  undefined1 local_538 [8];
  Food f3;
  string local_500;
  Point local_4e0;
  undefined1 local_4d8 [8];
  Food f2;
  string local_4a0;
  Point local_480;
  undefined1 local_478 [8];
  Food f1;
  string local_440;
  allocator<char> local_419;
  string local_418;
  Point local_3f8;
  undefined1 local_3f0 [8];
  Snake S2;
  string local_378;
  allocator<char> local_351;
  string local_350;
  Point local_330;
  undefined1 local_328 [8];
  Snake S1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  Point local_268;
  undefined1 local_260 [8];
  Snake B3;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  Point local_1a0;
  undefined1 local_198 [8];
  Snake B2;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  Point local_c8;
  undefined1 local_c0 [8];
  Snake B1;
  vector<Food_*,_std::allocator<Food_*>_> foods;
  vector<Snake_*,_std::allocator<Snake_*>_> snakes;
  bool player2;
  bool player1;
  Direction DStack_18;
  bool bots;
  int LEVEL;
  Direction direction_2;
  Direction direction_1;
  bool END_GAME;
  
  direction_1 = LEFT;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  direction_2._3_1_ = LEFT >> 0x18;
  LEVEL = 0;
  DStack_18 = LEFT;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 300;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_1_ = 0;
  snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_1_ = 0;
  std::vector<Snake_*,_std::allocator<Snake_*>_>::vector
            ((vector<Snake_*,_std::allocator<Snake_*>_> *)
             &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Food_*,_std::allocator<Food_*>_>::vector
            ((vector<Food_*,_std::allocator<Food_*>_> *)&B1.bot);
  Point::Point(&local_c8,0x16,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"BOT 1",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"\x1b[35m",(allocator<char> *)&B2.field_0x6f);
  Snake::Snake((Snake *)local_c0,local_c8,5,&local_f8,'o',&local_120,true);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&B2.field_0x6f);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  Point::Point(&local_1a0,0xd,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"BOT 2",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"\x1b[36m",(allocator<char> *)&B3.field_0x6f);
  Snake::Snake((Snake *)local_198,local_1a0,5,&local_1c0,'o',&local_1e8,true);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&B3.field_0x6f);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  Point::Point(&local_268,3,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"BOT 3",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"\x1b[32m",(allocator<char> *)&S1.field_0x6f);
  Snake::Snake((Snake *)local_260,local_268,5,&local_288,'o',&local_2b0,true);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&S1.field_0x6f);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  Point::Point(&local_330,3,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"PLAYER 1",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"\x1b[34m",(allocator<char> *)&S2.field_0x6f);
  Snake::Snake((Snake *)local_328,local_330,5,&local_350,'o',&local_378,false);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator((allocator<char> *)&S2.field_0x6f);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  Point::Point(&local_3f8,0x16,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"PLAYER 2",&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"\x1b[31m",
             (allocator<char> *)(f1.color.field_2._M_local_buf + 0xf));
  Snake::Snake((Snake *)local_3f0,local_3f8,5,&local_418,'o',&local_440,false);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)(f1.color.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  Point::Point(&local_480,0xf,10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"\x1b[1m\x1b[33m",
             (allocator<char> *)(f2.color.field_2._M_local_buf + 0xf));
  Food::Food((Food *)local_478,local_480,1,'1',&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)(f2.color.field_2._M_local_buf + 0xf));
  Point::Point(&local_4e0,10,10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"\x1b[1m\x1b[33m",
             (allocator<char> *)(f3.color.field_2._M_local_buf + 0xf));
  Food::Food((Food *)local_4d8,local_4e0,3,'3',&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)(f3.color.field_2._M_local_buf + 0xf));
  Point::Point(&local_540,0x14,10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"\x1b[1m\x1b[33m",&local_561);
  Food::Food((Food *)local_538,local_540,5,'5',&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  local_570 = (value_type)local_478;
  std::vector<Food_*,_std::allocator<Food_*>_>::push_back
            ((vector<Food_*,_std::allocator<Food_*>_> *)&B1.bot,&local_570);
  local_578 = (value_type)local_4d8;
  std::vector<Food_*,_std::allocator<Food_*>_>::push_back
            ((vector<Food_*,_std::allocator<Food_*>_> *)&B1.bot,&local_578);
  local_580 = (value_type)local_538;
  std::vector<Food_*,_std::allocator<Food_*>_>::push_back
            ((vector<Food_*,_std::allocator<Food_*>_> *)&B1.bot,&local_580);
  menu((bool *)((long)&snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3),
       (bool *)((long)&snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 2),
       (bool *)((long)&snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1));
  if ((snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) != 0) {
    local_588 = (value_type)local_c0;
    std::vector<Snake_*,_std::allocator<Snake_*>_>::push_back
              ((vector<Snake_*,_std::allocator<Snake_*>_> *)
               &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_588);
    local_590 = (value_type)local_198;
    std::vector<Snake_*,_std::allocator<Snake_*>_>::push_back
              ((vector<Snake_*,_std::allocator<Snake_*>_> *)
               &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_590);
    local_598 = (value_type)local_260;
    std::vector<Snake_*,_std::allocator<Snake_*>_>::push_back
              ((vector<Snake_*,_std::allocator<Snake_*>_> *)
               &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_598);
  }
  if ((snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._2_1_ & 1) != 0) {
    local_5a0 = (value_type)local_328;
    std::vector<Snake_*,_std::allocator<Snake_*>_>::push_back
              ((vector<Snake_*,_std::allocator<Snake_*>_> *)
               &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_5a0);
  }
  if ((snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._1_1_ & 1) != 0) {
    page.message.field_2._8_8_ = local_3f0;
    std::vector<Snake_*,_std::allocator<Snake_*>_>::push_back
              ((vector<Snake_*,_std::allocator<Snake_*>_> *)
               &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (value_type *)((long)&page.message.field_2 + 8));
  }
  Page::Page((Page *)&thread_for_read_input,
             (vector<Snake_*,_std::allocator<Snake_*>_> *)
             &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<Food_*,_std::allocator<Food_*>_> *)&B1.bot);
  Page::print((Page *)&thread_for_read_input);
  local_628 = std::ref<Direction>((Direction *)&LEVEL);
  local_630 = std::ref<Direction>(&stack0xffffffffffffffe8);
  local_638 = std::ref<bool>((bool *)((long)&direction_2 + 3));
  std::thread::
  thread<void(&)(Direction&,Direction&,bool&),std::reference_wrapper<Direction>,std::reference_wrapper<Direction>,std::reference_wrapper<bool>,void>
            (&local_620,read_input,&local_628,&local_630,&local_638);
  while (((direction_2._3_1_ ^ 0xff) & 1) != LEFT >> 0x18) {
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_640,
               (int *)((long)&snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_640);
    Page::move_once((Page *)&thread_for_read_input,(Direction *)&LEVEL,&stack0xffffffffffffffe8,
                    (bool *)((long)&direction_2 + 3));
    Page::print((Page *)&thread_for_read_input);
  }
  std::thread::join();
  std::thread::~thread(&local_620);
  Page::~Page((Page *)&thread_for_read_input);
  Food::~Food((Food *)local_538);
  Food::~Food((Food *)local_4d8);
  Food::~Food((Food *)local_478);
  Snake::~Snake((Snake *)local_3f0);
  Snake::~Snake((Snake *)local_328);
  Snake::~Snake((Snake *)local_260);
  Snake::~Snake((Snake *)local_198);
  Snake::~Snake((Snake *)local_c0);
  std::vector<Food_*,_std::allocator<Food_*>_>::~vector
            ((vector<Food_*,_std::allocator<Food_*>_> *)&B1.bot);
  std::vector<Snake_*,_std::allocator<Snake_*>_>::~vector
            ((vector<Snake_*,_std::allocator<Snake_*>_> *)
             &foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return direction_1;
}

Assistant:

int main()
{
	srand(time(0));	

    // Setting
	bool END_GAME = false;
	Direction direction_1 = LEFT;
	Direction direction_2 = LEFT;
	int LEVEL = EASY;
	bool bots = false;
	bool player1 = false;
	bool player2 = false;

	vector<Snake*> snakes;
	vector<Food*> foods;

	Snake B1(Point(22, 3), 5, "BOT 1", 'o', MAGENTA, BOT);
	Snake B2(Point(13, 3), 5, "BOT 2", 'o', CYAN, BOT);
	Snake B3(Point(3, 16), 5, "BOT 3", 'o', GREEN, BOT);

	Snake S1(Point(3, 3), 5, "PLAYER 1", 'o', BLUE, NOT_BOT);
	Snake S2(Point(22, 16), 5, "PLAYER 2", 'o', RED, NOT_BOT);

	Food f1(Point(15, 10), 1, '1', BOLDYELLOW);
	Food f2(Point(10, 10), 3, '3', BOLDYELLOW);
	Food f3(Point(20, 10), 5, '5', BOLDYELLOW);

	foods.push_back(&f1);
	foods.push_back(&f2);
	foods.push_back(&f3);

	menu(bots, player1, player2);
	
	// BOTS	
	if(bots)
	{
		snakes.push_back(&B1);
		snakes.push_back(&B2);
		snakes.push_back(&B3);
	}

	// PLAYERS
	if(player1)
		snakes.push_back(&S1);

	if(player2)	
		snakes.push_back(&S2);

	
	// Page setting
	Page page(snakes, foods);
	page.print();
	
	thread thread_for_read_input(read_input, ref(direction_1), ref(direction_2), ref(END_GAME));

	while(!END_GAME)
	{
        this_thread::sleep_for(chrono::milliseconds(LEVEL));
		page.move_once(direction_1, direction_2, END_GAME);
		page.print();	
	}
	thread_for_read_input.join();

}